

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_HashTable.h
# Opt level: O2

bool __thiscall
axl::sl::
HashTable<unsigned_long,_bool,_axl::sl::HashId<unsigned_long>,_axl::sl::Eq<unsigned_long,_unsigned_long>,_unsigned_long,_const_bool_&>
::setBucketCount(HashTable<unsigned_long,_bool,_axl::sl::HashId<unsigned_long>,_axl::sl::Eq<unsigned_long,_unsigned_long>,_unsigned_long,_const_bool_&>
                 *this,size_t bucketCount)

{
  size_t sVar1;
  ulong uVar2;
  bool bVar3;
  AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>
  *pAVar4;
  AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>
  *pAVar5;
  HashTableEntry<unsigned_long,_bool> *p;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_00;
  size_t i;
  size_t sVar6;
  Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
  newTable;
  ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
  local_48;
  
  local_48.m_p = (AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>
                  *)0x0;
  local_48.m_hdr = (Hdr *)0x0;
  local_48.m_count = 0;
  bVar3 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,bool>,axl::sl::HashTableEntry<unsigned_long,bool>::GetBucketLink>,axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,bool>,axl::sl::HashTableEntry<unsigned_long,bool>::GetBucketLink>>>
          ::
          setCountImpl<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,bool>,axl::sl::HashTableEntry<unsigned_long,bool>::GetBucketLink>>::Construct>
                    ((Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,bool>,axl::sl::HashTableEntry<unsigned_long,bool>::GetBucketLink>,axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,bool>,axl::sl::HashTableEntry<unsigned_long,bool>::GetBucketLink>>>
                      *)&local_48,bucketCount);
  if (bVar3) {
    pAVar4 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
             ::p(&this->m_table);
    pAVar5 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
             ::p((Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
                  *)&local_48);
    sVar1 = (this->m_table).
            super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
            .m_count;
    src = extraout_RDX;
    for (sVar6 = 0; sVar6 != sVar1; sVar6 = sVar6 + 1) {
      while (pAVar4[sVar6].
             super_ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>
             .super_ListData<axl::sl::HashTableEntry<unsigned_long,_bool>_>.m_head !=
             (HashTableEntry<unsigned_long,_bool> *)0x0) {
        p = ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>
            ::removeHead(&pAVar4[sVar6].
                          super_ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>
                        );
        uVar2 = (p->super_MapEntry<unsigned_long,_bool>).m_key;
        p->m_bucket = pAVar5 + uVar2 % bucketCount;
        ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>
        ::insertTail(&pAVar5[uVar2 % bucketCount].
                      super_ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>
                     ,p);
        src = extraout_RDX_00;
      }
    }
    Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
    ::copy(&this->m_table,(EVP_PKEY_CTX *)&local_48,src);
  }
  ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
  ::~ArrayRef(&local_48);
  return bVar3;
}

Assistant:

bool
	setBucketCount(size_t bucketCount) {
		Array<Bucket> newTable;
		bool result = newTable.setCount(bucketCount);
		if (!result)
			return false;

		typename Array<Bucket>::Rwi oldRwi = m_table;
		typename Array<Bucket>::Rwi newRwi = newTable;
		size_t oldBucketCount = m_table.getCount();
		for (size_t i = 0; i < oldBucketCount; i++) {
			Bucket* oldBucket = &oldRwi[i];
			while (!oldBucket->isEmpty()) {
				Entry* entry = oldBucket->removeHead();
				size_t hash = m_hash(entry->m_key);

				Bucket* newBucket = &newRwi[hash % bucketCount];
				entry->m_bucket = newBucket;
				newBucket->insertTail(entry);
			}
		}

		m_table = newTable;
		return true;
	}